

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Sector_SetFloorPanning
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  sector_t_conflict *psVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  double local_28;
  double dStack_20;
  FSectorTagIterator itr;
  
  auVar3._0_8_ = (double)arg2;
  auVar3._8_8_ = (double)arg4;
  auVar3 = divpd(auVar3,_DAT_005cfc30);
  if (arg0 == 0) {
    itr.start = 0;
  }
  else {
    itr.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_28 = auVar3._0_8_;
  dStack_20 = auVar3._8_8_;
  itr.searchtag = arg0;
  while( true ) {
    uVar2 = FSectorTagIterator::Next(&itr);
    if ((int)uVar2 < 0) break;
    psVar1 = sectors + uVar2;
    psVar1->planes[0].xform.xOffs = local_28 + (double)arg1;
    psVar1->planes[0].xform.yOffs = dStack_20 + (double)arg3;
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetFloorPanning)
// Sector_SetFloorPanning (tag, x-int, x-frac, y-int, y-frac)
{
	double xofs = arg1 + arg2 / 100.;
	double yofs = arg3 + arg4 / 100.;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		sectors[secnum].SetXOffset(sector_t::floor, xofs);
		sectors[secnum].SetYOffset(sector_t::floor, yofs);
	}
	return true;
}